

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# problem_16.cpp
# Opt level: O1

int main(void)

{
  int iVar1;
  long *plVar2;
  int i;
  vector<int,_std::allocator<int>_> numbers;
  int local_3c;
  vector<int,_std::allocator<int>_> local_38;
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Enter sequence of numbers separated by space.",0x2d);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"\nTo terminate the input enter \'.\' and press \'enter\':\n",
             0x35);
  local_38.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_38.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (int *)0x0;
  local_38.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (int *)0x0;
  local_3c = 0;
  while( true ) {
    plVar2 = (long *)std::istream::operator>>((istream *)&std::cin,&local_3c);
    if ((*(byte *)((long)plVar2 + *(long *)(*plVar2 + -0x18) + 0x20) & 5) != 0) break;
    if (local_38.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish ==
        local_38.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage) {
      std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                ((vector<int,std::allocator<int>> *)&local_38,
                 (iterator)
                 local_38.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish,&local_3c);
    }
    else {
      *local_38.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_finish = local_3c;
      local_38.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = local_38.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish + 1;
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"The mode is: ",0xd);
  iVar1 = findMode<int>(&local_38);
  plVar2 = (long *)std::ostream::operator<<((ostream *)&std::cout,iVar1);
  std::ios::widen((char)*(undefined8 *)(*plVar2 + -0x18) + (char)plVar2);
  std::ostream::put((char)plVar2);
  std::ostream::flush();
  if (local_38.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_38.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_38.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_38.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return 0;
}

Assistant:

int main()
{
	std::cout << "Enter sequence of numbers separated by space."
			  << "\nTo terminate the input enter '.' and press 'enter':\n";

	std::vector<int> numbers;
	for (auto i = 0; std::cin >> i;)
		numbers.push_back(i);
	std::cout << "The mode is: " << findMode(numbers) << std::endl;
	return 0;
}